

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testValid_Classifier_PredictedFeatureNameAndTarget(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar3;
  reference from;
  NeuralNetworkClassifier *this;
  NetworkUpdateParameters *this_00;
  LossLayer *this_01;
  CategoricalCrossEntropyLossLayer *this_02;
  string *psVar4;
  FeatureType *pFVar5;
  uchar this_03 [8];
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  Result local_218;
  FeatureDescription *trainingInput2;
  ArrayFeatureType *trainingInputTensorShape;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_1c0;
  FeatureDescription *trainingInput;
  FeatureDescription *trainingInput_1;
  FeatureDescription feature;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  pointer plStack_160;
  pointer local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_131;
  undefined1 local_130 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  undefined1 auStack_88 [8];
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  auStack_88 = (undefined1  [8])0x43d8fd;
  tensorAttributesIn.name = (char *)0x3;
  classLabels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"1",
             (allocator *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,"2",
             (allocator *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,"3",
             (allocator *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,"4",
             (allocator *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  classLabels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_131);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_130,
             &local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,
             &local_131);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_131);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_130);
  __range1 = (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0;
  plStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&__range1)
  ;
  buildBasicNeuralNetworkClassifierModel
            ((Model *)(local_68 + 0x28),true,(TensorAttributes *)auStack_88,&local_150,
             (vector<long,_std::allocator<long>_> *)&__range1,true);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  CoreML::Specification::Model::set_specificationversion((Model *)(local_68 + 0x28),4);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::clear_traininginput(pMVar2);
  pMVar2 = CoreML::Specification::Model::description((Model *)(local_68 + 0x28));
  pRVar3 = CoreML::Specification::ModelDescription::input(pMVar2);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar3);
  feature._40_8_ =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar3);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1,(iterator *)&feature._cached_size_), bVar1) {
    from = google::protobuf::internal::
           RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*(&__end1);
    CoreML::Specification::FeatureDescription::FeatureDescription
              ((FeatureDescription *)&trainingInput_1,from);
    pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    pRVar3 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
    trainingInput =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar3);
    CoreML::Specification::FeatureDescription::CopyFrom
              (trainingInput,(FeatureDescription *)&trainingInput_1);
    CoreML::Specification::FeatureDescription::~FeatureDescription
              ((FeatureDescription *)&trainingInput_1);
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar3 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  local_1c0._M_storage =
       (uchar  [8])
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar3);
  this = CoreML::Specification::Model::neuralnetworkclassifier((Model *)(local_68 + 0x28));
  this_00 = CoreML::Specification::NeuralNetworkClassifier::updateparams(this);
  this_01 = CoreML::Specification::NetworkUpdateParameters::losslayers(this_00,0);
  this_02 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(this_01);
  psVar4 = CoreML::Specification::CategoricalCrossEntropyLossLayer::target_abi_cxx11_(this_02);
  std::__cxx11::string::string((string *)&trainingInputTensorShape,(string *)psVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)local_1c0._M_storage,(string *)&trainingInputTensorShape);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)local_1c0._M_storage);
  trainingInput2 =
       (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)trainingInput2,ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)trainingInput2,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar3 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  this_03 = (uchar  [8])
            google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (pRVar3);
  local_218.m_message._M_storage._M_storage = this_03;
  pMVar2 = CoreML::Specification::Model::description((Model *)(local_68 + 0x28));
  psVar4 = CoreML::Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)this_03,psVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)local_218.m_message._M_storage._M_storage);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar5);
  CoreML::Model::validate(&local_218,(Model *)(local_68 + 0x28));
  CoreML::Result::operator=((Result *)local_68,&local_218);
  CoreML::Result::~Result(&local_218);
  bVar1 = CoreML::Result::good((Result *)local_68);
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x91c);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  spec._oneof_case_[0]._1_3_ = 0;
  spec._oneof_case_[0]._0_1_ = !bVar1;
  std::__cxx11::string::~string((string *)&trainingInputTensorShape);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88;
  do {
    local_3b0 = local_3b0 + -1;
    std::__cxx11::string::~string((string *)local_3b0);
  } while (local_3b0 != &local_108);
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testValid_Classifier_PredictedFeatureNameAndTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target + predicted feature nmae to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(spec.description().predictedfeaturename());
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}